

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_timer.c
# Opt level: O2

void oonf_timer_remove(oonf_timer_class *info)

{
  oonf_timer_instance *poVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  oonf_timer_instance *timer;
  
  if (((info->_node).next != (list_entity *)0x0) &&
     (poVar1 = (oonf_timer_instance *)_timer_tree.list_head.next,
     (info->_node).prev != (list_entity *)0x0)) {
    while (timer = poVar1, (timer->_node).list.prev != _timer_tree.list_head.prev) {
      poVar1 = (oonf_timer_instance *)(timer->_node).list.next;
      if (timer->class == info) {
        oonf_timer_stop(timer);
      }
    }
    plVar2 = (info->_node).next;
    plVar3 = (info->_node).prev;
    plVar3->next = plVar2;
    plVar2->prev = plVar3;
    (info->_node).next = (list_entity *)0x0;
    (info->_node).prev = (list_entity *)0x0;
  }
  return;
}

Assistant:

void
oonf_timer_remove(struct oonf_timer_class *info) {
  struct oonf_timer_instance *timer, *iterator;

  if (!list_is_node_added(&info->_node)) {
    /* only free node if its hooked to the timer core */
    return;
  }

  avl_for_each_element_safe(&_timer_tree, timer, _node, iterator) {
    if (timer->class == info) {
      oonf_timer_stop(timer);
    }
  }

  list_remove(&info->_node);
}